

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

bool __thiscall helics::CommonCore::isLocal(CommonCore *this,GlobalFederateId global_fedid)

{
  int iVar1;
  FedInfo **ppFVar2;
  long lVar3;
  FedInfo **ppFVar4;
  GlobalFederateId local_24;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_20;
  
  local_24.gid = global_fedid.gid;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_20,&this->loopFederates,&local_24);
  iVar1 = (this->loopFederates).dataStorage.bsize;
  ppFVar2 = (this->loopFederates).dataStorage.dataptr;
  lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar2 == (FedInfo **)0x0) {
    ppFVar4 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar4 = ppFVar2 + lVar3 + 1;
  }
  ppFVar2 = ppFVar2 + lVar3;
  if (iVar1 == 0x20) {
    ppFVar2 = ppFVar4;
    iVar1 = 0;
  }
  return local_20.vec != ppFVar2 || local_20.offset != iVar1;
}

Assistant:

bool CommonCore::isLocal(GlobalFederateId global_fedid) const
{
    return (loopFederates.find(global_fedid) != loopFederates.end());
}